

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O1

void pty_select_result(int fd,int event)

{
  void *pvVar1;
  char c [1];
  undefined1 local_d;
  int local_c;
  
  local_c = fd;
  if (pty_signal_pipe[0] == fd) {
    read(pty_signal_pipe[0],&local_d,1);
    pty_try_wait();
  }
  else {
    pvVar1 = find234(ptyfds,&local_c,ptyfd_find);
    if (pvVar1 != (void *)0x0) {
      pty_real_select_result(*(Pty **)((long)pvVar1 + 8),local_c,event,0);
    }
  }
  return;
}

Assistant:

void pty_select_result(int fd, int event)
{
    if (fd == pty_signal_pipe[0]) {
        char c[1];

        if (read(pty_signal_pipe[0], c, 1) <= 0)
            /* ignore error */;
        /* ignore its value; it'll be `x' */

        pty_try_wait();
    } else {
        PtyFd *ptyfd = find234(ptyfds, &fd, ptyfd_find);

        if (ptyfd)
            pty_real_select_result(ptyfd->pty, fd, event, 0);
    }
}